

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall Graph::calc_node_distance(Graph *this)

{
  int iVar1;
  int iVar2;
  Node *pNVar3;
  double **ppdVar4;
  double *pdVar5;
  ulong uVar6;
  double **ppdVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  double dVar15;
  double dVar16;
  
  uVar6 = (ulong)this->num_node;
  if (0 < (long)uVar6) {
    pNVar3 = this->nodes;
    ppdVar4 = this->distance_matrix;
    piVar8 = &pNVar3[1].y;
    lVar10 = 8;
    uVar11 = 0;
    ppdVar7 = ppdVar4;
    uVar9 = uVar6;
    do {
      uVar9 = uVar9 - 1;
      ppdVar7 = ppdVar7 + 1;
      uVar12 = uVar11 + 1;
      if (uVar12 < uVar6) {
        iVar1 = pNVar3[uVar11].x;
        iVar2 = pNVar3[uVar11].y;
        pdVar5 = ppdVar4[uVar11];
        uVar13 = 0;
        piVar14 = piVar8;
        do {
          dVar15 = (double)(iVar1 - ((Node *)(piVar14 + -1))->x);
          dVar16 = (double)(iVar2 - *piVar14);
          dVar15 = SQRT(dVar16 * dVar16 + dVar15 * dVar15);
          ppdVar7[uVar13][uVar11] = dVar15;
          *(double *)((long)pdVar5 + uVar13 * 8 + lVar10) = dVar15;
          uVar13 = uVar13 + 1;
          piVar14 = piVar14 + 8;
        } while (uVar9 != uVar13);
      }
      lVar10 = lVar10 + 8;
      piVar8 = piVar8 + 8;
      uVar11 = uVar12;
    } while (uVar12 != uVar6);
  }
  return;
}

Assistant:

void Graph::calc_node_distance()
{
	for(int i = 0; i < num_node; i++){
		for(int j = i + 1; j < num_node; j++){
			distance_matrix[i][j] = distance_matrix[j][i] = sqrt(pow(nodes[i].x - nodes[j].x, 2) + pow(nodes[i].y - nodes[j].y, 2));
		}
	}
}